

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O1

QOffscreenX11PlatformNativeInterface * __thiscall
QOffscreenX11Integration::nativeInterface(QOffscreenX11Integration *this)

{
  QOffscreenPlatformNativeInterface *pQVar1;
  QOffscreenPlatformNativeInterface *this_00;
  
  if ((this->super_QOffscreenIntegration).m_nativeInterface.d == (QPlatformNativeInterface *)0x0) {
    this_00 = (QOffscreenPlatformNativeInterface *)operator_new(0x28);
    QOffscreenPlatformNativeInterface::QOffscreenPlatformNativeInterface
              (this_00,&this->super_QOffscreenIntegration);
    *(undefined ***)this_00 = &PTR_metaObject_0011c490;
    *(undefined ***)(this_00 + 1) = &PTR__QOffscreenX11PlatformNativeInterface_0011c590;
    *(undefined8 *)&this_00[1].field_0x8 = 0;
    pQVar1 = (QOffscreenPlatformNativeInterface *)
             (this->super_QOffscreenIntegration).m_nativeInterface.d;
    if ((pQVar1 != this_00) &&
       ((this->super_QOffscreenIntegration).m_nativeInterface.d =
             (QPlatformNativeInterface *)this_00, pQVar1 != (QOffscreenPlatformNativeInterface *)0x0
       )) {
      (**(code **)(*(long *)pQVar1 + 0x20))();
    }
  }
  return (QOffscreenX11PlatformNativeInterface *)
         (this->super_QOffscreenIntegration).m_nativeInterface.d;
}

Assistant:

QOffscreenX11PlatformNativeInterface *QOffscreenX11Integration::nativeInterface() const
{
   if (!m_nativeInterface)
       m_nativeInterface.reset(new QOffscreenX11PlatformNativeInterface(const_cast<QOffscreenX11Integration *>(this)));
   return static_cast<QOffscreenX11PlatformNativeInterface *>(m_nativeInterface.data());
}